

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O0

void SET_OF_free(asn_TYPE_descriptor_t *td,void *ptr,int contents_only)

{
  long lVar1;
  long lVar2;
  int in_EDX;
  long *in_RSI;
  long in_RDI;
  void *memb_ptr;
  int i;
  asn_struct_ctx_t *ctx;
  asn_anonymous_set_ *list;
  asn_TYPE_member_t *elm;
  asn_SET_OF_specifics_t *specs;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar3;
  
  if ((in_RDI != 0) && (in_RSI != (long *)0x0)) {
    lVar1 = *(long *)(in_RDI + 0x88);
    for (iVar3 = 0; iVar3 < (int)in_RSI[1]; iVar3 = iVar3 + 1) {
      lVar2 = *(long *)(*in_RSI + (long)iVar3 * 8);
      if (lVar2 != 0) {
        (**(code **)(*(long *)(lVar1 + 0x18) + 0x10))(*(undefined8 *)(lVar1 + 0x18),lVar2,0);
      }
    }
    *(undefined4 *)(in_RSI + 1) = 0;
    asn_set_empty((void *)CONCAT44(iVar3,in_stack_ffffffffffffffc0));
    iVar3 = *(int *)(*(long *)(in_RDI + 0x98) + 4);
    if (*(long *)((long)in_RSI + (long)iVar3 + 8) != 0) {
      (**(code **)(*(long *)(lVar1 + 0x18) + 0x10))
                (*(undefined8 *)(lVar1 + 0x18),*(undefined8 *)((long)in_RSI + (long)iVar3 + 8),0);
      *(undefined8 *)((long)in_RSI + (long)iVar3 + 8) = 0;
    }
    if (in_EDX == 0) {
      free(in_RSI);
    }
  }
  return;
}

Assistant:

void
SET_OF_free(asn_TYPE_descriptor_t *td, void *ptr, int contents_only) {
	if(td && ptr) {
		asn_SET_OF_specifics_t *specs;
		asn_TYPE_member_t *elm = td->elements;
		asn_anonymous_set_ *list = _A_SET_FROM_VOID(ptr);
		asn_struct_ctx_t *ctx;	/* Decoder context */
		int i;

		/*
		 * Could not use set_of_empty() because of (*free)
		 * incompatibility.
		 */
		for(i = 0; i < list->count; i++) {
			void *memb_ptr = list->array[i];
			if(memb_ptr)
			ASN_STRUCT_FREE(*elm->type, memb_ptr);
		}
		list->count = 0;	/* No meaningful elements left */

		asn_set_empty(list);	/* Remove (list->array) */

		specs = (asn_SET_OF_specifics_t *)td->specifics;
		ctx = (asn_struct_ctx_t *)((char *)ptr + specs->ctx_offset);
		if(ctx->ptr) {
			ASN_STRUCT_FREE(*elm->type, ctx->ptr);
			ctx->ptr = 0;
		}

		if(!contents_only) {
			FREEMEM(ptr);
		}
	}
}